

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test2(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  reference piVar2;
  bool local_162;
  int *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_108 [8];
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> v2;
  int local_b8 [10];
  iterator local_90;
  size_type local_88;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> v1;
  less<int> local_51;
  undefined1 local_50 [8];
  priority_queue<int,_std::less<int>_> b;
  undefined1 local_28 [8];
  priority_queue<int,_std::less<int>_> a;
  
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_28,(less<int> *)&b.field_0x1f);
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_50,&local_51);
  local_b8[4] = 0xfffffffd;
  local_b8[5] = 9;
  local_b8[6] = 6;
  local_b8[0] = 1;
  local_b8[1] = 5;
  local_b8[2] = 4;
  local_b8[3] = 2;
  local_90 = local_b8;
  local_88 = 7;
  this = (allocator<int> *)
         ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 7);
  std::allocator<int>::allocator(this);
  __l_00._M_len = local_88;
  __l_00._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,__l_00,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_108[4] = 9;
  local_108[5] = 6;
  local_108[0] = 1;
  local_108[1] = 5;
  local_108[2] = 4;
  local_108[3] = 2;
  local_e8 = local_108;
  local_e0 = 6;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  __l._M_len = local_e0;
  __l._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d8,__l,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_80);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_80);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    CP::priority_queue<int,_std::less<int>_>::push
              ((priority_queue<int,_std::less<int>_> *)local_28,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_d8);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_d8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&x_1);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    CP::priority_queue<int,_std::less<int>_>::push
              ((priority_queue<int,_std::less<int>_> *)local_50,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  bVar1 = CP::priority_queue<int,_std::less<int>_>::operator==
                    ((priority_queue<int,_std::less<int>_> *)local_28,
                     (priority_queue<int,_std::less<int>_> *)local_50);
  local_162 = false;
  if (!bVar1) {
    local_162 = CP::priority_queue<int,_std::less<int>_>::operator==
                          ((priority_queue<int,_std::less<int>_> *)local_50,
                           (priority_queue<int,_std::less<int>_> *)local_28);
    local_162 = !local_162;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_50);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_28);
  return local_162;
}

Assistant:

bool test2() {
  CP::priority_queue<int> a,b;
  std::vector<int> v1 = {1,5,4,2,-3,9,6};
  std::vector<int> v2 = {1,5,4,2,9,6};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  return ( ((a == b) == false)  && ((b == a) == false));
}